

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  int iVar1;
  Extension *pEVar2;
  Descriptor *pDVar3;
  undefined4 extraout_var;
  MessageLite *pMVar4;
  undefined4 extraout_var_00;
  
  pEVar2 = FindOrNull(this,*(int *)(descriptor + 0x44));
  if (pEVar2 == (Extension *)0x0) {
    pMVar4 = (MessageLite *)0x0;
  }
  else {
    pMVar4 = (pEVar2->field_0).message_value;
    if ((pEVar2->field_0xa & 0x10) != 0) {
      pDVar3 = FieldDescriptor::message_type(descriptor);
      iVar1 = (*factory->_vptr_MessageFactory[2])(factory,pDVar3);
      iVar1 = (*pMVar4->_vptr_MessageLite[8])(pMVar4,CONCAT44(extraout_var,iVar1));
      pMVar4 = (MessageLite *)CONCAT44(extraout_var_00,iVar1);
      if ((this->arena_ == (Arena *)0x0) &&
         ((pEVar2->field_0).repeated_string_value !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0)) {
        (*(code *)(((((pEVar2->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)
                  ->impl_).hint_._M_b._M_p)();
      }
    }
    Erase(this,*(int *)(descriptor + 0x44));
  }
  return pMVar4;
}

Assistant:

MessageLite* ExtensionSet::UnsafeArenaReleaseMessage(
    const FieldDescriptor* descriptor, MessageFactory* factory) {
  Extension* extension = FindOrNull(descriptor->number());
  if (extension == NULL) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    MessageLite* ret = NULL;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->UnsafeArenaReleaseMessage(
          *factory->GetPrototype(descriptor->message_type()));
      if (arena_ == NULL) {
        delete extension->lazymessage_value;
      }
    } else {
      ret = extension->message_value;
    }
    Erase(descriptor->number());
    return ret;
  }
}